

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O1

char * __thiscall
icu_63::KeywordEnumeration::next(KeywordEnumeration *this,int32_t *resultLength,UErrorCode *status)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (__s = this->current, *__s != '\0')) {
    sVar2 = strlen(__s);
    iVar1 = (int)sVar2;
    this->current = __s + (iVar1 + 1);
  }
  else {
    iVar1 = 0;
    __s = (char *)0x0;
  }
  if (resultLength != (int32_t *)0x0) {
    *resultLength = iVar1;
  }
  return __s;
}

Assistant:

virtual const char* next(int32_t* resultLength, UErrorCode& status) {
        const char* result;
        int32_t len;
        if(U_SUCCESS(status) && *current != 0) {
            result = current;
            len = (int32_t)uprv_strlen(current);
            current += len+1;
            if(resultLength != NULL) {
                *resultLength = len;
            }
        } else {
            if(resultLength != NULL) {
                *resultLength = 0;
            }
            result = NULL;
        }
        return result;
    }